

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O0

__string_type *
qclab::qasm1<double>(__string_type *__return_storage_ptr__,char *type,int qubit,double angle)

{
  ostream *poVar1;
  qclab *this;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream stream;
  ostream local_1a0 [376];
  double local_28;
  double angle_local;
  char *pcStack_18;
  int qubit_local;
  char *type_local;
  
  local_28 = angle;
  angle_local._4_4_ = qubit;
  pcStack_18 = type;
  type_local = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,pcStack_18);
  this = (qclab *)0x13e13a;
  poVar1 = std::operator<<(poVar1,"(");
  qasm_abi_cxx11_(&local_1e0,this,local_28);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,") q[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,angle_local._4_4_);
  std::operator<<(poVar1,"];\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm1( const char type[] , const int qubit , const T angle ) {
    std::stringstream stream ;
    stream << type << "(" << qasm( angle ) << ") q[" << qubit << "];\n" ;
    return stream.str() ;
  }